

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O3

void __thiscall
TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_Test::
TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_Test
          (TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).fixture.result_ =
       (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).accountant.allocator_ =
       (AccountingTestMemoryAllocator *)0x0;
  *(undefined8 *)
   &(this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).fixture.
    ownsExecFunction_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).fixture.output_ =
       (StringBufferTestOutput *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).fixture.registry_ =
       (TestRegistry *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).fixture.genTest_ =
       (ExecFunctionTestShell *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).testFunction.parameter_ =
       (GlobalSimpleStringMemoryAccountant *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).fixture.
  _vptr_TestTestingFixture = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).testFunction.
  super_ExecFunction._vptr_ExecFunction = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).testFunction.
  testFunction_ = (_func_void_GlobalSimpleStringMemoryAccountant_ptr *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).stash.originalAllocator_
       = (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).accountant.accountant_ =
       (MemoryAccountant *)0x0;
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant_003643f0;
  GlobalSimpleStringAllocatorStash::GlobalSimpleStringAllocatorStash
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).stash);
  ExecFunction::ExecFunction
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).testFunction.
              super_ExecFunction);
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).testFunction.
  super_ExecFunction._vptr_ExecFunction = (_func_int **)&PTR__ExecFunctionWithoutParameters_00364430
  ;
  TestTestingFixture::TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).fixture);
  GlobalSimpleStringMemoryAccountant::GlobalSimpleStringMemoryAccountant
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).accountant);
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant_003617a8;
  return;
}

Assistant:

TEST(GlobalSimpleStringMemoryAccountant, reportUseCaches)
{
    size_t caches[] = {32};
    accountant.useCacheSizes(caches, 1);
    SimpleString str;
    accountant.start();
    str += "More";
    accountant.stop();
    STRCMP_CONTAINS("32                   1                1                 1", accountant.report().asCharString());
}